

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLECompressState<unsigned_long,_true>::RLECompressState
          (RLECompressState<unsigned_long,_true> *this,ColumnDataCheckpointData *checkpoint_data_p,
          CompressionInfo *info)

{
  CompressionInfo CVar1;
  unique_ptr<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>,_true> uVar2;
  CompressionInfo *in_RDX;
  undefined8 in_RSI;
  CompressionInfo in_RDI;
  idx_t in_stack_00000038;
  RLECompressState<unsigned_long,_true> *in_stack_00000040;
  RLECompressState<unsigned_long,_true> *in_stack_ffffffffffffffa0;
  BufferHandle *this_00;
  CompressionInfo *pCVar3;
  ColumnDataCheckpointData *in_stack_ffffffffffffffd0;
  
  CompressionState::CompressionState((CompressionState *)in_RDI.block_manager,in_RDX);
  (in_RDI.block_manager)->_vptr_BlockManager = (_func_int **)&PTR__RLECompressState_0350fb00;
  ((CompressionState *)&(in_RDI.block_manager)->blocks_lock)->_vptr_CompressionState =
       (_func_int **)in_RSI;
  pCVar3 = &((CompressionState *)&(in_RDI.block_manager)->blocks_lock)->info;
  CVar1.block_manager =
       (BlockManager *)
       ColumnDataCheckpointData::GetCompressionFunction
                 (in_stack_ffffffffffffffd0,(CompressionType)((ulong)pCVar3 >> 0x38));
  pCVar3->block_manager = CVar1.block_manager;
  this_00 = (BufferHandle *)((long)&(in_RDI.block_manager)->blocks_lock + 0x10);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa63d24);
  BufferHandle::BufferHandle(this_00);
  RLEState<unsigned_long>::RLEState((RLEState<unsigned_long> *)in_stack_ffffffffffffffa0);
  (((CompressionState *)((long)&(in_RDI.block_manager)->blocks + 0x28))->info).block_manager =
       (BlockManager *)0x0;
  ColumnDataCheckpointData::GetRowGroup((ColumnDataCheckpointData *)0xa63d5f);
  CreateEmptySegment(in_stack_00000040,in_stack_00000038);
  (((CompressionState *)((long)&(in_RDI.block_manager)->blocks + 0x18))->info).block_manager =
       in_RDI.block_manager;
  uVar2.super_unique_ptr<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>.
  _M_t.super___uniq_ptr_impl<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::MetadataManager_*,_std::default_delete<duckdb::MetadataManager>_>.
  super__Head_base<0UL,_duckdb::MetadataManager_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>)
       MaxRLECount(in_stack_ffffffffffffffa0);
  ((in_RDI.block_manager)->metadata_manager).
  super_unique_ptr<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_> =
       uVar2.
       super_unique_ptr<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::MetadataManager,_std::default_delete<duckdb::MetadataManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MetadataManager_*,_std::default_delete<duckdb::MetadataManager>_>
       .super__Head_base<0UL,_duckdb::MetadataManager_*,_false>._M_head_impl;
  return;
}

Assistant:

RLECompressState(ColumnDataCheckpointData &checkpoint_data_p, const CompressionInfo &info)
	    : CompressionState(info), checkpoint_data(checkpoint_data_p),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_RLE)) {
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);

		state.dataptr = (void *)this;
		max_rle_count = MaxRLECount();
	}